

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

void __thiscall
TreePropagator::walkBrokenBridges
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *reachable,
          vector<bool,_std::allocator<bool>_> *walked,vector<bool,_std::allocator<bool>_> *visited,
          int avoidBridge,vector<int,_std::allocator<int>_> *bridges,bool isArt,int parent)

{
  bool bVar1;
  ulong __n;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  vector<bool,_std::allocator<bool>_> *in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  vector<bool,_std::allocator<bool>_> *in_RDI;
  vector<bool,_std::allocator<bool>_> *in_R8;
  int in_R9D;
  reference rVar5;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  undefined8 in_stack_00000008;
  undefined1 uStack0000000000000010;
  int in_stack_00000018;
  int other;
  int e0;
  int e1;
  int e;
  uint i;
  undefined8 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  uint in_stack_ffffffffffffff50;
  int iVar6;
  size_type in_stack_ffffffffffffff58;
  reference local_98;
  reference local_88;
  reference local_78;
  reference local_68;
  int local_54;
  int local_50;
  int local_4c;
  value_type local_48;
  uint local_44;
  undefined3 in_stack_ffffffffffffffd0;
  uint uVar7;
  undefined4 in_stack_fffffffffffffff0;
  
  uVar7 = CONCAT13(uStack0000000000000010,in_stack_ffffffffffffffd0) & 0x1ffffff;
  rVar5 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,in_stack_ffffffffffffff58);
  std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc0,true);
  local_44 = 0;
  do {
    __n = (ulong)local_44;
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
                          (long)in_ESI);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(pvVar2);
    if (sVar3 <= __n) {
      return;
    }
    pvVar2 = std::
             vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           *)&in_RDI[2].super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset,
                          (long)in_ESI);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(ulong)local_44);
    local_48 = *pvVar4;
    local_4c = GraphPropagator::getEndnode
                         ((GraphPropagator *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                          (int)in_stack_ffffffffffffff38);
    local_50 = GraphPropagator::getEndnode
                         ((GraphPropagator *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int)((ulong)in_stack_ffffffffffffff38 >> 0x20),
                          (int)in_stack_ffffffffffffff38);
    iVar6 = local_50;
    if (local_50 == in_ESI) {
      iVar6 = local_4c;
    }
    local_54 = iVar6;
    if (((((uVar7 & 0x1000000) == 0) || (iVar6 != in_R9D)) &&
        (((uVar7 & 0x1000000) != 0 || (local_48 != in_R9D)))) && (iVar6 != in_stack_00000018)) {
      GraphPropagator::getEdgeVar
                ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      bVar1 = BoolView::isFixed((BoolView *)0x1e7cbd);
      if (bVar1) {
        GraphPropagator::getEdgeVar
                  ((GraphPropagator *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                   (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        bVar1 = BoolView::isFalse((BoolView *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (bVar1) {
          local_68 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,__n);
          bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_68);
          in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 & 0xffffff;
          if (bVar1) {
            local_78 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,__n);
            bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_78);
            in_stack_ffffffffffffff50 = in_stack_ffffffffffffff50 & 0xffffff;
            if (!bVar1) {
              local_88 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,__n);
              bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_88);
              in_stack_ffffffffffffff50 =
                   CONCAT13(bVar1,(int3)in_stack_ffffffffffffff50) ^ 0xff000000;
            }
          }
          if ((in_stack_ffffffffffffff50 & 0x1000000) != 0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(iVar6,in_stack_ffffffffffffff50),
                       (value_type_conflict *)
                       CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
            goto LAB_001e7e2c;
          }
        }
      }
      local_98 = std::vector<bool,_std::allocator<bool>_>::operator[](in_RDI,__n);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_98);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        in_stack_ffffffffffffff40 = (uint)((byte)(uVar7 >> 0x18) & 1);
        in_stack_ffffffffffffff38 = in_stack_00000008;
        iVar6 = in_ESI;
        walkBrokenBridges((TreePropagator *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                          (int)((ulong)in_RDX >> 0x20),in_RCX,in_R8,
                          (vector<bool,_std::allocator<bool>_> *)CONCAT44(in_R9D,uVar7),
                          rVar5._M_mask._4_4_,unaff_retaddr,rVar5._M_mask._3_1_,
                          _uStack0000000000000010);
        in_stack_ffffffffffffff48 = in_ESI;
        in_ESI = iVar6;
      }
    }
LAB_001e7e2c:
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void TreePropagator::walkBrokenBridges(int r, std::vector<bool>& reachable,
																			 std::vector<bool>& walked, std::vector<bool>& visited,
																			 int avoidBridge, std::vector<edge_id>& bridges, bool isArt,
																			 int parent) {
	// cout << "Walking my island again.... :" << r<<" "<<avoidBridge<<endl;
	visited[r] = true;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (isArt && other == avoidBridge) {
			continue;
		}
		if (!isArt && e == avoidBridge) {
			continue;
		}
		if (other == parent) {
			continue;
		}
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			// cout << other<<" "<<reachable[other] <<" "<< walked[other]<<endl;
			if (reachable[other] && !walked[other] && !visited[other]) {
				bridges.push_back(e);
				continue;
			}
		}
		if (!visited[other]) {
			walkBrokenBridges(other, reachable, walked, visited, avoidBridge, bridges, isArt, r);
		}
	}
}